

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O1

void __thiscall
kj::_::ChainPromiseNode::ChainPromiseNode
          (ChainPromiseNode *this,Own<kj::_::PromiseNode> *innerParam)

{
  PromiseNode *pPVar1;
  EventLoop *pEVar2;
  
  (this->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR___cxa_pure_virtual_0064ca08;
  (this->super_Event)._vptr_Event = (_func_int **)&PTR_getInnerForTrace_0064c6a0;
  pEVar2 = anon_unknown_54::currentEventLoop();
  (this->super_Event).loop = pEVar2;
  (this->super_Event).next = (Event *)0x0;
  (this->super_Event).prev = (Event **)0x0;
  (this->super_Event).firing = false;
  (this->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_0064c810;
  (this->super_Event)._vptr_Event = (_func_int **)&DAT_0064c848;
  *(undefined4 *)&(this->super_Event).field_0x24 = 0;
  (this->inner).disposer = innerParam->disposer;
  (this->inner).ptr = innerParam->ptr;
  innerParam->ptr = (PromiseNode *)0x0;
  this->onReadyEvent = (Event *)0x0;
  this->selfPtr = (Own<kj::_::PromiseNode> *)0x0;
  pPVar1 = (this->inner).ptr;
  (*pPVar1->_vptr_PromiseNode[1])(pPVar1,&this->inner);
  pPVar1 = (this->inner).ptr;
  (**pPVar1->_vptr_PromiseNode)(pPVar1,&this->super_Event);
  return;
}

Assistant:

ChainPromiseNode::ChainPromiseNode(Own<PromiseNode> innerParam)
    : state(STEP1), inner(kj::mv(innerParam)) {
  inner->setSelfPointer(&inner);
  inner->onReady(this);
}